

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddNestedExtensions<google::protobuf::DescriptorProto>
          (DescriptorIndex *this,string_view filename,DescriptorProto *message_type)

{
  int iVar1;
  bool bVar2;
  Rep *pRVar3;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  void **ppvVar4;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar5;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar6;
  int *piVar7;
  
  this_00 = &(message_type->field_0)._impl_.nested_type_;
  pRVar5 = this_00;
  if ((*(byte *)((long)&message_type->field_0 + 0x20) & 1) != 0) {
    pRVar3 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar5 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar3->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar3 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar3->elements;
    }
  }
  iVar1 = *(int *)((long)&message_type->field_0 + 0x28);
  for (; pRVar5 != (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar5 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
               &(pRVar5->super_RepeatedPtrFieldBase).current_size_) {
    bVar2 = AddNestedExtensions<google::protobuf::DescriptorProto>
                      (this,filename,
                       (DescriptorProto *)(pRVar5->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    if (!bVar2) {
      return false;
    }
  }
  this_01 = &(message_type->field_0)._impl_.extension_;
  pRVar6 = this_01;
  if ((*(byte *)((long)&message_type->field_0 + 0x68) & 1) != 0) {
    pRVar3 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    pRVar6 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar3->elements;
    if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar3 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
      this_01 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar3->elements;
    }
  }
  ppvVar4 = &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
            *(int *)((long)&message_type->field_0 + 0x70);
  if (pRVar6 == (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)ppvVar4) {
    bVar2 = true;
  }
  else {
    do {
      piVar7 = &(pRVar6->super_RepeatedPtrFieldBase).current_size_;
      bVar2 = AddExtension<google::protobuf::FieldDescriptorProto>
                        (this,filename,
                         (FieldDescriptorProto *)
                         (pRVar6->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
      if (!bVar2) {
        return bVar2;
      }
      pRVar6 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)piVar7;
    } while ((void **)piVar7 != ppvVar4);
  }
  return bVar2;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddNestedExtensions(
    absl::string_view filename, const DescProto& message_type) {
  for (const auto& nested_type : message_type.nested_type()) {
    if (!AddNestedExtensions(filename, nested_type)) return false;
  }
  for (const auto& extension : message_type.extension()) {
    if (!AddExtension(filename, extension)) return false;
  }
  return true;
}